

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O2

wchar_t lha_read_file_extended_header
                  (archive_read *a,lha *lha,uint16_t *crc,wchar_t sizefield_length,
                  uint64_t limitsize,size_t *total_size)

{
  char cVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint16_t uVar4;
  uint uVar5;
  uint uVar6;
  uchar *p;
  uint *pp;
  void *pp_00;
  archive_string_conv *paVar7;
  ulong uVar8;
  uchar *p_2;
  uint64_t *p_00;
  char *pcVar9;
  size_t min;
  archive_string *as;
  ulong min_00;
  ulong uVar10;
  archive_string local_48;
  ulong len;
  
  min_00 = (ulong)(uint)sizefield_length;
  *total_size = min_00;
  uVar5 = sizefield_length + L'\x01';
  len = (ulong)uVar5;
  while (pp = (uint *)__archive_read_ahead(a,min_00,(ssize_t *)0x0), pp != (uint *)0x0) {
    if (sizefield_length == L'\x02') {
      min = (size_t)(ushort)*pp;
    }
    else {
      min = (size_t)*pp;
    }
    if (min == 0) {
      if (crc != (uint16_t *)0x0) {
        uVar4 = lha_crc16(*crc,pp,min_00);
        *crc = uVar4;
      }
      __archive_read_consume(a,min_00);
      return L'\0';
    }
    if ((min <= min_00) || (limitsize < *total_size + min)) goto LAB_00122072;
    pp_00 = __archive_read_ahead(a,min,(ssize_t *)0x0);
    if (pp_00 == (void *)0x0) break;
    *total_size = *total_size + min;
    cVar1 = *(char *)((long)pp_00 + min_00);
    if ((crc != (uint16_t *)0x0) && (cVar1 != '\0')) {
      uVar4 = lha_crc16(*crc,pp_00,min);
      *crc = uVar4;
    }
    uVar10 = min - len;
    p_00 = (uint64_t *)((long)pp_00 + len);
    uVar6 = (uint)min;
    switch(cVar1) {
    case '@':
      if (uVar10 == 2) {
        lha->dos_attr = (uchar)*p_00;
      }
      break;
    case 'A':
      if (uVar10 == 0x18) {
        ntfs_to_unix(*p_00,&lha->birthtime,&lha->birthtime_tv_nsec);
        ntfs_to_unix(p_00[1],&lha->mtime,&lha->mtime_tv_nsec);
        ntfs_to_unix(p_00[2],&lha->atime,&lha->atime_tv_nsec);
        *(byte *)&lha->setflag = (byte)lha->setflag | 3;
      }
      break;
    case 'B':
      if (uVar10 == 0x10) {
        uVar2 = *p_00;
        lha->compsize = uVar2;
        uVar3 = p_00[1];
        lha->origsize = uVar3;
        if (((long)uVar2 < 0) || ((long)uVar3 < 0)) goto LAB_00122072;
      }
      break;
    case 'C':
    case 'G':
    case 'H':
    case 'I':
    case 'J':
    case 'K':
    case 'L':
    case 'M':
    case 'N':
    case 'O':
      break;
    case 'D':
      if (uVar6 == uVar5) {
LAB_00121fd6:
        (lha->filename).length = 0;
      }
      else {
        if (((uVar10 & 1) != 0) || ((char)*p_00 == '\0')) goto LAB_00122072;
        (lha->filename).length = 0;
        archive_array_append(&lha->filename,(char *)p_00,uVar10);
        paVar7 = archive_string_conversion_from_charset(&a->archive,"UTF-16LE",L'\x01');
        lha->sconv_fname = paVar7;
joined_r0x00121f0f:
        if (paVar7 == (archive_string_conv *)0x0) {
          return L'\xffffffe2';
        }
      }
      break;
    case 'E':
      if (((uVar6 == uVar5) || ((uVar10 & 1) != 0)) || ((char)*p_00 == '\0')) {
LAB_00122072:
        archive_set_error(&a->archive,0x54,"Invalid extended LHa header");
        return L'\xffffffe2';
      }
      (lha->dirname).length = 0;
      archive_array_append(&lha->dirname,(char *)p_00,uVar10);
      paVar7 = archive_string_conversion_from_charset(&a->archive,"UTF-16LE",L'\x01');
      lha->sconv_dir = paVar7;
      if (paVar7 == (archive_string_conv *)0x0) {
        return L'\xffffffe2';
      }
      pcVar9 = (lha->dirname).s;
      uVar10 = (lha->dirname).length >> 1;
      for (uVar6 = 0; uVar8 = (ulong)uVar6, uVar8 < uVar10; uVar6 = uVar6 + 1) {
        if (*(short *)(pcVar9 + uVar8 * 2) == -1) {
          (pcVar9 + uVar8 * 2)[0] = '/';
          (pcVar9 + uVar8 * 2)[1] = '\0';
        }
      }
      if (*(short *)(pcVar9 + uVar10 * 2 + -2) != 0x2f) goto LAB_00122072;
      break;
    case 'F':
      if (uVar10 == 4) {
        local_48.buffer_length = 0;
        local_48.s = (char *)0x0;
        local_48.length = 0;
        pcVar9 = "UTF-8";
        if ((uint)*p_00 != 0xfde9) {
          archive_string_sprintf(&local_48,"CP%d");
          pcVar9 = local_48.s;
        }
        paVar7 = archive_string_conversion_from_charset(&a->archive,pcVar9,L'\x01');
        lha->sconv_dir = paVar7;
        paVar7 = archive_string_conversion_from_charset(&a->archive,pcVar9,L'\x01');
        lha->sconv_fname = paVar7;
        archive_string_free(&local_48);
        if (lha->sconv_dir == (archive_string_conv *)0x0) {
          return L'\xffffffe2';
        }
        paVar7 = lha->sconv_fname;
        goto joined_r0x00121f0f;
      }
      break;
    case 'P':
      if (uVar10 == 2) {
        lha->mode = (uint)(ushort)*p_00;
        *(byte *)&lha->setflag = (byte)lha->setflag | 4;
      }
      break;
    case 'Q':
      if (uVar10 == 4) {
        lha->gid = (ulong)(ushort)*p_00;
        lha->uid = (ulong)*(ushort *)((long)p_00 + 2);
      }
      break;
    case 'R':
      if (uVar6 != uVar5) {
        (lha->gname).length = 0;
        as = &lha->gname;
LAB_00122047:
        archive_strncat(as,p_00,uVar10);
      }
      break;
    case 'S':
      if (uVar6 != uVar5) {
        (lha->uname).length = 0;
        as = &lha->uname;
        goto LAB_00122047;
      }
      break;
    case 'T':
      if (uVar10 == 4) {
        lha->mtime = (ulong)(uint)*p_00;
      }
      break;
    default:
      if (cVar1 == -1) {
        if (uVar10 == 0x14) {
          lha->mode = (uint)*p_00;
          lha->gid = (ulong)*(uint *)((long)p_00 + 4);
          lha->uid = (ulong)(uint)p_00[1];
          lha->birthtime = (ulong)*(uint *)((long)p_00 + 0xc);
          uVar6 = (uint)p_00[2];
LAB_00122018:
          lha->atime = (ulong)uVar6;
          *(byte *)&lha->setflag = (byte)lha->setflag | 7;
        }
      }
      else {
        if (cVar1 == '\x01') {
          if (uVar6 != uVar5) {
            if ((char)*p_00 == '\0') goto LAB_00122072;
            (lha->filename).length = 0;
            as = &lha->filename;
            goto LAB_00122047;
          }
          goto LAB_00121fd6;
        }
        if (cVar1 == '\x02') {
          if ((uVar6 == uVar5) || ((char)*p_00 == '\0')) goto LAB_00122072;
          (lha->dirname).length = 0;
          archive_strncat(&lha->dirname,p_00,uVar10);
          uVar6 = 0;
          while( true ) {
            uVar8 = (ulong)uVar6;
            pcVar9 = (lha->dirname).s;
            uVar10 = (lha->dirname).length;
            if (uVar10 <= uVar8) break;
            if (pcVar9[uVar8] == -1) {
              pcVar9[uVar8] = '/';
            }
            uVar6 = uVar6 + 1;
          }
          if (pcVar9[uVar10 - 1] != '/') goto LAB_00122072;
        }
        else if (cVar1 == '\x7f') {
          if (uVar10 == 0x10) {
            lha->dos_attr = (uchar)*p_00;
            lha->mode = (uint)*(ushort *)((long)p_00 + 2);
            lha->gid = (ulong)*(ushort *)((long)p_00 + 4);
            lha->uid = (ulong)*(ushort *)((long)p_00 + 6);
            lha->birthtime = (ulong)(uint)p_00[1];
            uVar6 = *(uint *)((long)p_00 + 0xc);
            goto LAB_00122018;
          }
        }
        else if (((cVar1 == '\0') && (1 < uVar10)) &&
                (lha->header_crc = (ushort)*p_00, crc != (uint16_t *)0x0)) {
          uVar4 = lha_crc16(*crc,pp_00,len);
          *crc = uVar4;
          uVar4 = lha_crc16(uVar4,"",2);
          *crc = uVar4;
          uVar4 = lha_crc16(uVar4,(ushort *)((long)p_00 + 2),uVar10 - 2);
          *crc = uVar4;
        }
      }
    }
    __archive_read_consume(a,min);
  }
  truncated_error(a);
  return L'\xffffffe2';
}

Assistant:

static int
lha_read_file_extended_header(struct archive_read *a, struct lha *lha,
    uint16_t *crc, int sizefield_length, uint64_t limitsize, size_t *total_size)
{
	const void *h;
	const unsigned char *extdheader;
	size_t	extdsize;
	size_t	datasize;
	unsigned int i;
	unsigned char extdtype;

#define EXT_HEADER_CRC		0x00		/* Header CRC and information*/
#define EXT_FILENAME		0x01		/* Filename 		    */
#define EXT_DIRECTORY		0x02		/* Directory name	    */
#define EXT_DOS_ATTR		0x40		/* MS-DOS attribute	    */
#define EXT_TIMESTAMP		0x41		/* Windows time stamp	    */
#define EXT_FILESIZE		0x42		/* Large file size	    */
#define EXT_TIMEZONE		0x43		/* Time zone		    */
#define EXT_UTF16_FILENAME	0x44		/* UTF-16 filename 	    */
#define EXT_UTF16_DIRECTORY	0x45		/* UTF-16 directory name    */
#define EXT_CODEPAGE		0x46		/* Codepage		    */
#define EXT_UNIX_MODE		0x50		/* File permission	    */
#define EXT_UNIX_GID_UID	0x51		/* gid,uid		    */
#define EXT_UNIX_GNAME		0x52		/* Group name		    */
#define EXT_UNIX_UNAME		0x53		/* User name		    */
#define EXT_UNIX_MTIME		0x54		/* Modified time	    */
#define EXT_OS2_NEW_ATTR	0x7f		/* new attribute(OS/2 only) */
#define EXT_NEW_ATTR		0xff		/* new attribute	    */

	*total_size = sizefield_length;

	for (;;) {
		/* Read an extended header size. */
		if ((h =
		    __archive_read_ahead(a, sizefield_length, NULL)) == NULL)
			return (truncated_error(a));
		/* Check if the size is the zero indicates the end of the
		 * extended header. */
		if (sizefield_length == sizeof(uint16_t))
			extdsize = archive_le16dec(h);
		else
			extdsize = archive_le32dec(h);
		if (extdsize == 0) {
			/* End of extended header */
			if (crc != NULL)
				*crc = lha_crc16(*crc, h, sizefield_length);
			__archive_read_consume(a, sizefield_length);
			return (ARCHIVE_OK);
		}

		/* Sanity check to the extended header size. */
		if (((uint64_t)*total_size + extdsize) > limitsize ||
		    extdsize <= (size_t)sizefield_length)
			goto invalid;

		/* Read the extended header. */
		if ((h = __archive_read_ahead(a, extdsize, NULL)) == NULL)
			return (truncated_error(a));
		*total_size += extdsize;

		extdheader = (const unsigned char *)h;
		/* Get the extended header type. */
		extdtype = extdheader[sizefield_length];
		/* Calculate an extended data size. */
		datasize = extdsize - (1 + sizefield_length);
		/* Skip an extended header size field and type field. */
		extdheader += sizefield_length + 1;

		if (crc != NULL && extdtype != EXT_HEADER_CRC)
			*crc = lha_crc16(*crc, h, extdsize);
		switch (extdtype) {
		case EXT_HEADER_CRC:
			/* We only use a header CRC. Following data will not
			 * be used. */
			if (datasize >= 2) {
				lha->header_crc = archive_le16dec(extdheader);
				if (crc != NULL) {
					static const char zeros[2] = {0, 0};
					*crc = lha_crc16(*crc, h,
					    extdsize - datasize);
					/* CRC value itself as zero */
					*crc = lha_crc16(*crc, zeros, 2);
					*crc = lha_crc16(*crc,
					    extdheader+2, datasize - 2);
				}
			}
			break;
		case EXT_FILENAME:
			if (datasize == 0) {
				/* maybe directory header */
				archive_string_empty(&lha->filename);
				break;
			}
			if (extdheader[0] == '\0')
				goto invalid;
			archive_strncpy(&lha->filename,
			    (const char *)extdheader, datasize);
			break;
		case EXT_UTF16_FILENAME:
			if (datasize == 0) {
				/* maybe directory header */
				archive_string_empty(&lha->filename);
				break;
			} else if (datasize & 1) {
				/* UTF-16 characters take always 2 or 4 bytes */
				goto invalid;
			}
			if (extdheader[0] == '\0')
				goto invalid;
			archive_string_empty(&lha->filename);
			archive_array_append(&lha->filename,
				(const char *)extdheader, datasize);
			/* Setup a string conversion for a filename. */
			lha->sconv_fname =
			    archive_string_conversion_from_charset(&a->archive,
			        "UTF-16LE", 1);
			if (lha->sconv_fname == NULL)
				return (ARCHIVE_FATAL);
			break;
		case EXT_DIRECTORY:
			if (datasize == 0 || extdheader[0] == '\0')
				/* no directory name data. exit this case. */
				goto invalid;

			archive_strncpy(&lha->dirname,
		  	    (const char *)extdheader, datasize);
			/*
			 * Convert directory delimiter from 0xFF
			 * to '/' for local system.
	 		 */
			for (i = 0; i < lha->dirname.length; i++) {
				if ((unsigned char)lha->dirname.s[i] == 0xFF)
					lha->dirname.s[i] = '/';
			}
			/* Is last character directory separator? */
			if (lha->dirname.s[lha->dirname.length-1] != '/')
				/* invalid directory data */
				goto invalid;
			break;
		case EXT_UTF16_DIRECTORY:
			/* UTF-16 characters take always 2 or 4 bytes */
			if (datasize == 0 || (datasize & 1) ||
			    extdheader[0] == '\0') {
				/* no directory name data. exit this case. */
				goto invalid;
			}

			archive_string_empty(&lha->dirname);
			archive_array_append(&lha->dirname,
				(const char *)extdheader, datasize);
			lha->sconv_dir =
			    archive_string_conversion_from_charset(&a->archive,
			        "UTF-16LE", 1);
			if (lha->sconv_dir == NULL)
				return (ARCHIVE_FATAL);
			else {
				/*
				 * Convert directory delimiter from 0xFFFF
				 * to '/' for local system.
				 */
				uint16_t dirSep;
				uint16_t d = 1;
				if (archive_be16dec(&d) == 1)
					dirSep = 0x2F00;
				else
					dirSep = 0x002F;

				/* UTF-16LE character */
				uint16_t *utf16name =
				    (uint16_t *)lha->dirname.s;
				for (i = 0; i < lha->dirname.length / 2; i++) {
					if (utf16name[i] == 0xFFFF) {
						utf16name[i] = dirSep;
					}
				}
				/* Is last character directory separator? */
				if (utf16name[lha->dirname.length / 2 - 1] !=
				    dirSep) {
					/* invalid directory data */
					goto invalid;
				}
			}
			break;
		case EXT_DOS_ATTR:
			if (datasize == 2)
				lha->dos_attr = (unsigned char)
				    (archive_le16dec(extdheader) & 0xff);
			break;
		case EXT_TIMESTAMP:
			if (datasize == (sizeof(uint64_t) * 3)) {
				ntfs_to_unix(archive_le64dec(extdheader),
					&lha->birthtime,
				    &lha->birthtime_tv_nsec);
				extdheader += sizeof(uint64_t);
				ntfs_to_unix(archive_le64dec(extdheader),
					&lha->mtime,
				    &lha->mtime_tv_nsec);
				extdheader += sizeof(uint64_t);
				ntfs_to_unix(archive_le64dec(extdheader),
					&lha->atime,
				    &lha->atime_tv_nsec);
				lha->setflag |= BIRTHTIME_IS_SET |
				    ATIME_IS_SET;
			}
			break;
		case EXT_FILESIZE:
			if (datasize == sizeof(uint64_t) * 2) {
				lha->compsize = archive_le64dec(extdheader);
				extdheader += sizeof(uint64_t);
				lha->origsize = archive_le64dec(extdheader);
				if (lha->compsize < 0 || lha->origsize < 0)
					goto invalid;
			}
			break;
		case EXT_CODEPAGE:
			/* Get an archived filename charset from codepage.
			 * This overwrites the charset specified by
			 * hdrcharset option. */
			if (datasize == sizeof(uint32_t)) {
				struct archive_string cp;
				const char *charset;

				archive_string_init(&cp);
				switch (archive_le32dec(extdheader)) {
				case 65001: /* UTF-8 */
					charset = "UTF-8";
					break;
				default:
					archive_string_sprintf(&cp, "CP%d",
					    (int)archive_le32dec(extdheader));
					charset = cp.s;
					break;
				}
				lha->sconv_dir =
				    archive_string_conversion_from_charset(
					&(a->archive), charset, 1);
				lha->sconv_fname =
				    archive_string_conversion_from_charset(
					&(a->archive), charset, 1);
				archive_string_free(&cp);
				if (lha->sconv_dir == NULL)
					return (ARCHIVE_FATAL);
				if (lha->sconv_fname == NULL)
					return (ARCHIVE_FATAL);
			}
			break;
		case EXT_UNIX_MODE:
			if (datasize == sizeof(uint16_t)) {
				lha->mode = archive_le16dec(extdheader);
				lha->setflag |= UNIX_MODE_IS_SET;
			}
			break;
		case EXT_UNIX_GID_UID:
			if (datasize == (sizeof(uint16_t) * 2)) {
				lha->gid = archive_le16dec(extdheader);
				lha->uid = archive_le16dec(extdheader+2);
			}
			break;
		case EXT_UNIX_GNAME:
			if (datasize > 0)
				archive_strncpy(&lha->gname,
				    (const char *)extdheader, datasize);
			break;
		case EXT_UNIX_UNAME:
			if (datasize > 0)
				archive_strncpy(&lha->uname,
				    (const char *)extdheader, datasize);
			break;
		case EXT_UNIX_MTIME:
			if (datasize == sizeof(uint32_t))
				lha->mtime = archive_le32dec(extdheader);
			break;
		case EXT_OS2_NEW_ATTR:
			/* This extended header is OS/2 depend. */
			if (datasize == 16) {
				lha->dos_attr = (unsigned char)
				    (archive_le16dec(extdheader) & 0xff);
				lha->mode = archive_le16dec(extdheader+2);
				lha->gid = archive_le16dec(extdheader+4);
				lha->uid = archive_le16dec(extdheader+6);
				lha->birthtime = archive_le32dec(extdheader+8);
				lha->atime = archive_le32dec(extdheader+12);
				lha->setflag |= UNIX_MODE_IS_SET
				    | BIRTHTIME_IS_SET | ATIME_IS_SET;
			}
			break;
		case EXT_NEW_ATTR:
			if (datasize == 20) {
				lha->mode = (mode_t)archive_le32dec(extdheader);
				lha->gid = archive_le32dec(extdheader+4);
				lha->uid = archive_le32dec(extdheader+8);
				lha->birthtime = archive_le32dec(extdheader+12);
				lha->atime = archive_le32dec(extdheader+16);
				lha->setflag |= UNIX_MODE_IS_SET
				    | BIRTHTIME_IS_SET | ATIME_IS_SET;
			}
			break;
		case EXT_TIMEZONE:		/* Not supported */
			break;
		default:
			break;
		}

		__archive_read_consume(a, extdsize);
	}
invalid:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Invalid extended LHa header");
	return (ARCHIVE_FATAL);
}